

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.hxx
# Opt level: O0

String * __thiscall
cm::String::replace(String *this,const_iterator first,const_iterator last,size_type count2,char ch)

{
  const_iterator pvVar1;
  type pSVar2;
  undefined1 local_50 [8];
  string out;
  char ch_local;
  size_type count2_local;
  const_iterator last_local;
  const_iterator first_local;
  String *this_local;
  
  out.field_2._M_local_buf[0xf] = ch;
  std::__cxx11::string::string((string *)local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::begin(&this->view_);
  std::basic_string_view<char,_std::char_traits<char>_>::end(&this->view_);
  std::__cxx11::string::reserve((ulong)local_50);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::begin(&this->view_);
  std::__cxx11::string::append<char_const*,void>((string *)local_50,pvVar1,first);
  std::__cxx11::string::append((ulong)local_50,(char)count2);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::end(&this->view_);
  std::__cxx11::string::append<char_const*,void>((string *)local_50,last,pvVar1);
  pSVar2 = operator=(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_50);
  std::__cxx11::string::~string((string *)local_50);
  return pSVar2;
}

Assistant:

String& replace(const_iterator first, const_iterator last, size_type count2,
                  char ch)
  {
    std::string out;
    out.reserve((first - this->view_.begin()) + count2 +
                (this->view_.end() - last));
    out.append(this->view_.begin(), first);
    out.append(count2, ch);
    out.append(last, this->view_.end());
    return *this = std::move(out);
  }